

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

void __thiscall
testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Action
          (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this,
          ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *impl
          )

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>*>
            (&_Stack_10,impl);
  (this->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fun_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = impl;
  puVar1[1] = _Stack_10._M_pi;
  *(undefined8 **)&(this->fun_).super__Function_base._M_functor = puVar1;
  (this->fun_)._M_invoker =
       std::
       _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::ActionAdapter>
       ::_M_invoke;
  (this->fun_).super__Function_base._M_manager =
       std::
       _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::ActionAdapter>
       ::_M_manager;
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}